

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

void xmlFreeDtd(xmlDtdPtr cur)

{
  _xmlNode *p_Var1;
  xmlNodePtr cur_00;
  int iVar2;
  xmlDeregisterNodeFunc *pp_Var3;
  _xmlDict *dict;
  
  if (cur != (xmlDtdPtr)0x0) {
    if (cur->doc == (_xmlDoc *)0x0) {
      dict = (xmlDictPtr)0x0;
    }
    else {
      dict = cur->doc->dict;
    }
    if ((__xmlRegisterCallbacks != 0) &&
       (pp_Var3 = __xmlDeregisterNodeDefaultValue(), *pp_Var3 != (xmlDeregisterNodeFunc)0x0)) {
      pp_Var3 = __xmlDeregisterNodeDefaultValue();
      (**pp_Var3)((xmlNodePtr)cur);
    }
    p_Var1 = cur->children;
    while (cur_00 = p_Var1, cur_00 != (xmlNodePtr)0x0) {
      p_Var1 = cur_00->next;
      if ((XML_ENTITY_DECL < cur_00->type) ||
         ((0x39000U >> (cur_00->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)) {
        xmlUnlinkNode(cur_00);
        xmlFreeNode(cur_00);
      }
    }
    if ((cur->name != (xmlChar *)0x0) &&
       ((dict == (xmlDictPtr)0x0 || (iVar2 = xmlDictOwns(dict,cur->name), iVar2 == 0)))) {
      (*xmlFree)(cur->name);
    }
    if ((cur->SystemID != (xmlChar *)0x0) &&
       ((dict == (xmlDictPtr)0x0 || (iVar2 = xmlDictOwns(dict,cur->SystemID), iVar2 == 0)))) {
      (*xmlFree)(cur->SystemID);
    }
    if ((cur->ExternalID != (xmlChar *)0x0) &&
       ((dict == (xmlDictPtr)0x0 || (iVar2 = xmlDictOwns(dict,cur->ExternalID), iVar2 == 0)))) {
      (*xmlFree)(cur->ExternalID);
    }
    if ((xmlNotationTablePtr)cur->notations != (xmlNotationTablePtr)0x0) {
      xmlFreeNotationTable((xmlNotationTablePtr)cur->notations);
    }
    if ((xmlElementTablePtr)cur->elements != (xmlElementTablePtr)0x0) {
      xmlFreeElementTable((xmlElementTablePtr)cur->elements);
    }
    if ((xmlAttributeTablePtr)cur->attributes != (xmlAttributeTablePtr)0x0) {
      xmlFreeAttributeTable((xmlAttributeTablePtr)cur->attributes);
    }
    if ((xmlEntitiesTablePtr)cur->entities != (xmlEntitiesTablePtr)0x0) {
      xmlFreeEntitiesTable((xmlEntitiesTablePtr)cur->entities);
    }
    if ((xmlEntitiesTablePtr)cur->pentities != (xmlEntitiesTablePtr)0x0) {
      xmlFreeEntitiesTable((xmlEntitiesTablePtr)cur->pentities);
    }
    (*xmlFree)(cur);
    return;
  }
  return;
}

Assistant:

void
xmlFreeDtd(xmlDtdPtr cur) {
    xmlDictPtr dict = NULL;

    if (cur == NULL) {
	return;
    }
    if (cur->doc != NULL) dict = cur->doc->dict;

    if ((__xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
	xmlDeregisterNodeDefaultValue((xmlNodePtr)cur);

    if (cur->children != NULL) {
	xmlNodePtr next, c = cur->children;

	/*
	 * Cleanup all nodes which are not part of the specific lists
	 * of notations, elements, attributes and entities.
	 */
        while (c != NULL) {
	    next = c->next;
	    if ((c->type != XML_NOTATION_NODE) &&
	        (c->type != XML_ELEMENT_DECL) &&
		(c->type != XML_ATTRIBUTE_DECL) &&
		(c->type != XML_ENTITY_DECL)) {
		xmlUnlinkNode(c);
		xmlFreeNode(c);
	    }
	    c = next;
	}
    }
    DICT_FREE(cur->name)
    DICT_FREE(cur->SystemID)
    DICT_FREE(cur->ExternalID)
    /* TODO !!! */
    if (cur->notations != NULL)
        xmlFreeNotationTable((xmlNotationTablePtr) cur->notations);

    if (cur->elements != NULL)
        xmlFreeElementTable((xmlElementTablePtr) cur->elements);
    if (cur->attributes != NULL)
        xmlFreeAttributeTable((xmlAttributeTablePtr) cur->attributes);
    if (cur->entities != NULL)
        xmlFreeEntitiesTable((xmlEntitiesTablePtr) cur->entities);
    if (cur->pentities != NULL)
        xmlFreeEntitiesTable((xmlEntitiesTablePtr) cur->pentities);

    xmlFree(cur);
}